

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_misc.cpp
# Opt level: O1

void __thiscall
amrex::MLNodeLaplacian::compGrad(MLNodeLaplacian *this,int amrlev,MultiFab *grad,MultiFab *sol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  FabType FVar16;
  long lVar17;
  int *piVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  void *__s;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  bool bVar40;
  bool bVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  MFIter mfi;
  uint local_2b8;
  long local_2b0;
  long local_290;
  uint local_244;
  int local_240;
  Box local_23c;
  int local_220;
  uint local_21c;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  double local_208;
  double local_200;
  double local_1f8;
  FabArray<amrex::FArrayBox> *local_1f0;
  FabArray<amrex::EBCellFlagFab> *local_1e8;
  FabArray<amrex::FArrayBox> *local_1e0;
  long local_1d8;
  ulong local_1d0;
  long local_1c8;
  Array4<double> local_1c0;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_180;
  long local_178;
  FabArray<amrex::FArrayBox> *local_170;
  ulong local_168;
  long local_160;
  long local_158;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  lVar17 = *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  local_1f8 = *(double *)(lVar17 + 0x38);
  local_200 = *(double *)(lVar17 + 0x40);
  local_208 = *(double *)(lVar17 + 0x48);
  lVar17 = **(long **)&(this->super_MLNodeLinOp).super_MLLinOp.m_factory.
                       super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[amrlev].
                       super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ;
  local_1e0 = &grad->super_FabArray<amrex::FArrayBox>;
  local_170 = &sol->super_FabArray<amrex::FArrayBox>;
  if (lVar17 == 0) {
    local_178 = 0;
  }
  else {
    local_178 = __dynamic_cast(lVar17,&FabFactory<amrex::FArrayBox>::typeinfo,
                               &EBFArrayBoxFactory::typeinfo,0);
  }
  bVar40 = local_178 == 0;
  if (bVar40) {
    local_1e8 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    local_1f0 = (FabArray<amrex::FArrayBox> *)0x0;
  }
  else {
    local_1e8 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(local_178 + 0xd8));
    local_1f0 = &EBDataCollection::getVolFrac(*(EBDataCollection **)(local_178 + 0xd8))->
                 super_FabArray<amrex::FArrayBox>;
  }
  local_180._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (this->m_integral).
       super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
  MFIter::MFIter(&local_90,&local_1e0->super_FabArrayBase,true);
  if (local_90.currentIndex < local_90.endIndex) {
    dVar43 = local_1f8 * 0.25;
    dVar44 = local_200 * 0.25;
    dVar45 = local_208 * 0.25;
    do {
      MFIter::tilebox(&local_23c,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_1c0,local_1e0,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_150,local_170,&local_90);
      iVar14 = local_23c.bigend.vect[2];
      iVar13 = local_23c.bigend.vect[1];
      iVar12 = local_23c.bigend.vect[0];
      iVar11 = local_23c.smallend.vect[2];
      iVar10 = local_23c.smallend.vect[1];
      iVar27 = local_23c.smallend.vect[0];
      lVar22 = (long)local_23c.smallend.vect[0];
      lVar19 = (long)local_23c.smallend.vect[1];
      uVar15 = local_23c.bigend.vect[0] - local_23c.smallend.vect[0];
      iVar20 = local_23c.bigend.vect[1] - local_23c.smallend.vect[1];
      local_2b0 = 0;
      lVar17 = 0;
      do {
        uVar9 = iVar11;
        if (iVar11 <= iVar14) {
          do {
            if (iVar10 <= iVar13) {
              lVar34 = local_1c0.jstride * 8;
              __s = (void *)((long)local_1c0.p +
                            local_1c0.nstride * local_2b0 +
                            (lVar19 - local_1c0.begin.y) * lVar34 +
                            (int)(uVar9 - local_1c0.begin.z) * local_1c0.kstride * 8 +
                            (long)local_1c0.begin.x * -8 + lVar22 * 8);
              iVar37 = iVar20 + 1;
              do {
                if (iVar27 <= iVar12) {
                  memset(__s,0,(ulong)uVar15 * 8 + 8);
                }
                __s = (void *)((long)__s + lVar34);
                iVar37 = iVar37 + -1;
              } while (iVar37 != 0);
            }
            bVar41 = uVar9 != iVar14;
            uVar9 = uVar9 + 1;
          } while (bVar41);
        }
        lVar17 = lVar17 + 1;
        local_2b0 = local_2b0 + 8;
      } while (lVar17 != 3);
      bVar41 = bVar40;
      if (local_178 != 0) {
        piVar18 = &local_90.currentIndex;
        if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar18 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_90.currentIndex;
        }
        FVar16 = EBCellFlagFab::getType
                           ((local_1e8->m_fabs_v).
                            super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[*piVar18],&local_23c);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_d0,local_1f0,&local_90);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_110,
                   (FabArray<amrex::FArrayBox> *)
                   local_180._M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_90);
        if (FVar16 != covered) {
          if (FVar16 != singlevalued) {
            bVar41 = true;
            goto LAB_006dfa02;
          }
          local_21c = local_23c.bigend.vect[2];
          if (local_23c.smallend.vect[2] <= local_23c.bigend.vect[2]) {
            local_168 = (ulong)(uint)local_23c.bigend.vect[1];
            local_1d8 = (long)local_23c.smallend.vect[1];
            local_160 = (long)local_23c.smallend.vect[0];
            local_210 = local_23c.bigend.vect[1] + 1;
            local_218 = local_23c.smallend.vect[0] + 1;
            lVar17 = local_160 * 8;
            local_220 = local_23c.smallend.vect[1] + 1;
            local_20c = local_23c.bigend.vect[0];
            uVar15 = local_23c.smallend.vect[2];
            local_244 = local_23c.smallend.vect[2];
            do {
              local_244 = local_244 + 1;
              local_1d0 = (ulong)uVar15;
              if (local_23c.smallend.vect[1] <= local_23c.bigend.vect[1]) {
                local_1c8 = (long)(int)uVar15;
                local_214 = uVar15 + 1;
                local_158 = local_d0.jstride * 8;
                lVar19 = (long)local_d0.p +
                         (local_1d8 - local_d0.begin.y) * local_158 +
                         (local_1c8 - local_d0.begin.z) * local_d0.kstride * 8 +
                         (long)local_d0.begin.x * -8 + lVar17;
                local_290 = local_1d8;
                local_240 = local_220;
                do {
                  if (local_23c.smallend.vect[0] <= local_23c.bigend.vect[0]) {
                    lVar22 = (long)local_150.begin.x;
                    lVar21 = local_150.jstride * (local_290 - local_150.begin.y);
                    lVar25 = (int)(uVar15 - local_150.begin.z) * local_150.kstride;
                    lVar38 = (long)local_1c0.begin.x;
                    lVar32 = (local_290 - local_1c0.begin.y) * local_1c0.jstride;
                    lVar26 = (local_1c8 - local_1c0.begin.z) * local_1c0.kstride;
                    lVar30 = (((int)local_290 - local_150.begin.y) + 1) * local_150.jstride;
                    lVar33 = (local_214 - local_150.begin.z) * local_150.kstride;
                    lVar23 = (long)(int)(local_244 - local_150.begin.z) * local_150.kstride * 8;
                    lVar31 = (local_1c8 - local_150.begin.z) * local_150.kstride * 8;
                    lVar34 = (local_290 - local_150.begin.y) * local_150.jstride * 8;
                    lVar39 = (long)(local_240 - local_150.begin.y) * local_150.jstride * 8;
                    lVar35 = (local_290 - local_110.begin.y) * local_110.jstride;
                    lVar24 = (local_1c8 - local_110.begin.z) * local_110.kstride;
                    lVar28 = (long)local_110.begin.x;
                    lVar29 = 0;
                    do {
                      dVar47 = *(double *)(lVar19 + lVar29 * 8);
                      if ((dVar47 != 0.0) || (NAN(dVar47))) {
                        lVar36 = (long)((local_218 - local_150.begin.x) + (int)lVar29);
                        dVar1 = local_150.p[lVar21 + lVar36 + lVar25];
                        dVar2 = local_150.p[lVar21 + lVar36 + lVar33];
                        dVar3 = local_150.p[lVar30 + lVar36 + lVar25];
                        dVar4 = local_150.p[lVar30 + lVar36 + lVar33];
                        dVar5 = *(double *)
                                 ((long)local_150.p +
                                 lVar29 * 8 + lVar34 + lVar31 + lVar22 * -8 + lVar17);
                        dVar6 = *(double *)
                                 ((long)local_150.p +
                                 lVar29 * 8 + lVar39 + lVar31 + lVar22 * -8 + lVar17);
                        dVar7 = *(double *)
                                 ((long)local_150.p +
                                 lVar29 * 8 + lVar34 + lVar23 + lVar22 * -8 + lVar17);
                        dVar8 = *(double *)
                                 ((long)local_150.p +
                                 lVar29 * 8 + lVar23 + lVar39 + lVar22 * -8 + lVar17);
                        dVar46 = ((dVar4 - dVar8) - dVar2) + dVar7;
                        dVar49 = ((((dVar3 + dVar46) - dVar6) - dVar1) + dVar5) / dVar47;
                        dVar48 = ((((((dVar2 + (dVar4 - dVar8)) - dVar7) - dVar3) + dVar6) - dVar1)
                                 + dVar5) / dVar47;
                        dVar42 = ((((((dVar8 + dVar4) - dVar2) - dVar7) - dVar3) - dVar6) + dVar1 +
                                 dVar5) / dVar47;
                        dVar47 = (((dVar46 - dVar3) + dVar6 + dVar1) - dVar5) / dVar47;
                        local_1c0.p[local_160 + ((lVar32 + lVar26 + lVar29) - lVar38)] =
                             (local_110.p
                              [local_160 +
                               ((lVar35 + lVar24 + local_110.nstride * 8 + lVar29) - lVar28)] *
                              dVar47 + local_110.p
                                       [local_160 +
                                        ((lVar35 + lVar24 + local_110.nstride * 2 + lVar29) - lVar28
                                        )] * 0.5 * dVar48 +
                                       local_110.p
                                       [local_160 +
                                        ((local_110.nstride + lVar35 + lVar24 + lVar29) - lVar28)] *
                                       0.5 * dVar49 +
                                       (((((((dVar1 - dVar5) - dVar6) + dVar3) - dVar7) + dVar2) -
                                        dVar8) + dVar4) * 0.25) * local_1f8 +
                             local_1c0.p[local_160 + ((lVar32 + lVar26 + lVar29) - lVar38)];
                        local_1c0.p
                        [local_160 + ((local_1c0.nstride + lVar32 + lVar26 + lVar29) - lVar38)] =
                             (local_110.p
                              [local_160 +
                               ((lVar35 + lVar24 + local_110.nstride * 7 + lVar29) - lVar28)] *
                              dVar47 + local_110.p
                                       [local_160 +
                                        ((lVar35 + lVar24 + local_110.nstride * 2 + lVar29) - lVar28
                                        )] * 0.5 * dVar42 +
                                       local_110.p
                                       [local_160 + ((lVar35 + lVar24 + lVar29) - lVar28)] * 0.5 *
                                       dVar49 + (((((-dVar5 - dVar1) + dVar6 + dVar3) - dVar7) -
                                                 dVar2) + dVar8 + dVar4) * 0.25) * local_200 +
                             local_1c0.p
                             [local_160 + ((local_1c0.nstride + lVar32 + lVar26 + lVar29) - lVar38)]
                        ;
                        local_1c0.p
                        [local_160 + ((lVar32 + lVar26 + local_1c0.nstride * 2 + lVar29) - lVar38)]
                             = (dVar47 * local_110.p
                                         [local_160 +
                                          ((lVar35 + lVar24 + local_110.nstride * 6 + lVar29) -
                                          lVar28)] +
                               local_110.p
                               [local_160 +
                                ((local_110.nstride + lVar35 + lVar24 + lVar29) - lVar28)] * 0.5 *
                               dVar42 + local_110.p
                                        [local_160 + ((lVar35 + lVar24 + lVar29) - lVar28)] * 0.5 *
                                        dVar48 + ((((-dVar5 - dVar1) - dVar6) - dVar3) + dVar7 +
                                                  dVar2 + dVar8 + dVar4) * 0.25) * local_208 +
                               local_1c0.p
                               [local_160 +
                                ((lVar32 + lVar26 + local_1c0.nstride * 2 + lVar29) - lVar38)];
                      }
                      else {
                        local_1c0.p
                        [local_160 + ((lVar32 + lVar26 + local_1c0.nstride * 2 + lVar29) - lVar38)]
                             = 0.0;
                        local_1c0.p
                        [local_160 + ((local_1c0.nstride + lVar32 + lVar26 + lVar29) - lVar38)] =
                             0.0;
                        local_1c0.p[local_160 + ((lVar32 + lVar26 + lVar29) - lVar38)] = 0.0;
                      }
                      lVar29 = lVar29 + 1;
                    } while ((local_23c.bigend.vect[0] - local_23c.smallend.vect[0]) + 1 !=
                             (int)lVar29);
                  }
                  local_290 = local_290 + 1;
                  local_240 = local_240 + 1;
                  lVar19 = lVar19 + local_158;
                } while (local_210 != (int)local_290);
              }
              bVar41 = uVar15 != local_23c.bigend.vect[2];
              uVar15 = uVar15 + 1;
            } while (bVar41);
          }
        }
        bVar41 = false;
      }
LAB_006dfa02:
      if ((bVar41) && (local_23c.smallend.vect[2] <= local_23c.bigend.vect[2])) {
        lVar19 = (long)local_23c.smallend.vect[1];
        lVar17 = (long)local_23c.smallend.vect[0] * 8;
        local_2b8 = local_23c.smallend.vect[2];
        uVar15 = local_23c.smallend.vect[2];
        do {
          local_2b8 = local_2b8 + 1;
          if (local_23c.smallend.vect[1] <= local_23c.bigend.vect[1]) {
            lVar26 = (long)local_150.begin.x;
            lVar34 = (long)local_1c0.begin.x;
            lVar31 = local_1c0.jstride * 8;
            lVar22 = (lVar19 - local_1c0.begin.y) * lVar31 +
                     ((long)(int)uVar15 - (long)local_1c0.begin.z) * local_1c0.kstride * 8;
            lVar25 = (long)local_1c0.p + lVar22 + lVar34 * -8 + lVar17;
            lVar23 = (long)local_1c0.p + lVar22 + local_1c0.nstride * 8 + lVar34 * -8 + lVar17;
            lVar24 = (long)local_1c0.p + local_1c0.nstride * 0x10 + lVar22 + lVar34 * -8 + lVar17;
            lVar30 = local_150.jstride * 8;
            lVar22 = (lVar19 - local_150.begin.y) * lVar30;
            lVar34 = (long)(int)(local_2b8 - local_150.begin.z) * local_150.kstride * 8;
            lVar29 = ((long)(int)uVar15 - (long)local_150.begin.z) * local_150.kstride * 8;
            iVar27 = (local_23c.smallend.vect[1] + 1) - local_150.begin.y;
            lVar28 = (long)local_150.p + lVar22 + lVar34 + lVar26 * -8 + lVar17 + 8;
            lVar21 = (long)local_150.p + lVar22 + lVar29 + lVar26 * -8 + lVar17 + 8;
            lVar22 = lVar19;
            do {
              if (local_23c.smallend.vect[0] <= local_23c.bigend.vect[0]) {
                lVar32 = iVar27 * lVar30 + lVar34 + lVar26 * -8 + lVar17;
                lVar33 = iVar27 * lVar30 + lVar29 + lVar26 * -8 + lVar17;
                lVar35 = 0;
                do {
                  *(double *)(lVar25 + lVar35 * 8) =
                       (((((((*(double *)(lVar21 + lVar35 * 8) -
                             *(double *)(lVar21 + -8 + lVar35 * 8)) -
                            *(double *)((long)local_150.p + lVar35 * 8 + lVar33)) +
                           *(double *)((long)local_150.p + lVar35 * 8 + lVar33 + 8)) -
                          *(double *)(lVar28 + -8 + lVar35 * 8)) + *(double *)(lVar28 + lVar35 * 8))
                        - *(double *)((long)local_150.p + lVar35 * 8 + lVar32)) +
                       *(double *)((long)local_150.p + lVar35 * 8 + lVar32 + 8)) * dVar43 +
                       *(double *)(lVar25 + lVar35 * 8);
                  *(double *)(lVar23 + lVar35 * 8) =
                       (((((-*(double *)(lVar21 + -8 + lVar35 * 8) -
                           *(double *)(lVar21 + lVar35 * 8)) +
                           *(double *)((long)local_150.p + lVar35 * 8 + lVar33) +
                          *(double *)((long)local_150.p + lVar35 * 8 + lVar33 + 8)) -
                         *(double *)(lVar28 + -8 + lVar35 * 8)) - *(double *)(lVar28 + lVar35 * 8))
                        + *(double *)((long)local_150.p + lVar35 * 8 + lVar32) +
                       *(double *)((long)local_150.p + lVar35 * 8 + lVar32 + 8)) * dVar44 +
                       *(double *)(lVar23 + lVar35 * 8);
                  *(double *)(lVar24 + lVar35 * 8) =
                       ((((-*(double *)(lVar21 + -8 + lVar35 * 8) - *(double *)(lVar21 + lVar35 * 8)
                          ) - *(double *)((long)local_150.p + lVar35 * 8 + lVar33)) -
                        *(double *)((long)local_150.p + lVar35 * 8 + lVar33 + 8)) +
                        *(double *)(lVar28 + -8 + lVar35 * 8) + *(double *)(lVar28 + lVar35 * 8) +
                        *(double *)((long)local_150.p + lVar35 * 8 + lVar32) +
                       *(double *)((long)local_150.p + lVar35 * 8 + lVar32 + 8)) * dVar45 +
                       *(double *)(lVar24 + lVar35 * 8);
                  lVar35 = lVar35 + 1;
                } while ((local_23c.bigend.vect[0] - local_23c.smallend.vect[0]) + 1 != (int)lVar35)
                ;
              }
              lVar22 = lVar22 + 1;
              lVar25 = lVar25 + lVar31;
              lVar23 = lVar23 + lVar31;
              lVar24 = lVar24 + lVar31;
              lVar28 = lVar28 + lVar30;
              lVar21 = lVar21 + lVar30;
              iVar27 = iVar27 + 1;
            } while (local_23c.bigend.vect[1] + 1U != (int)lVar22);
          }
          bVar41 = uVar15 != local_23c.bigend.vect[2];
          uVar15 = uVar15 + 1;
        } while (bVar41);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MLNodeLaplacian::compGrad (int amrlev, MultiFab& grad, MultiFab& sol) const
{
#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    Real sigma = Real(-1.0);

    AMREX_ASSERT(grad.nComp() >= AMREX_SPACEDIM);

    const auto dxinv = m_geom[amrlev][0].InvCellSizeArray();
#ifdef AMREX_USE_EB
    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
    const MultiFab* intg = m_integral[amrlev].get();
#endif

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(grad, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& garr = grad.array(mfi);
        Array4<Real const> const& solarr = sol.const_array(mfi);

        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, AMREX_SPACEDIM, i, j, k, n,
        {
            garr(i,j,k,n) = 0.0;
        });

#ifdef AMREX_USE_EB
        bool regular = !factory;
        if (factory)
        {
            auto type = (*flags)[mfi].getType(bx);
            Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
            Array4<Real const> const& intgarr = intg->const_array(mfi);
            if (type == FabType::covered)
            { }
            else if (type == FabType::singlevalued)
            {
              AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
              {
                  mlndlap_mknewu_eb_c(i,j,k, garr, solarr, sigma, vfracarr, intgarr, dxinv);
              });
            }
            else
            {
                regular = true;
            }
        }
        if (regular)
#endif
        {

#if (AMREX_SPACEDIM == 2)
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
            {
                mlndlap_mknewu_c(i,j,k,garr,solarr,sigma,dxinv,is_rz);
            });
#else
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
            {
                mlndlap_mknewu_c(i,j,k,garr,solarr,sigma,dxinv);
            });
#endif
        }
    }
}